

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_enrich3(REF_GRID ref_grid)

{
  REF_MPI pRVar1;
  REF_NODE ref_node;
  uint uVar2;
  REF_STATUS RVar3;
  void *__s;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  REF_EDGE ref_edge_00;
  long lVar7;
  REF_CELL pRVar8;
  char *pcVar9;
  REF_INT RVar10;
  int iVar11;
  REF_INT node;
  REF_EDGE ref_edge;
  REF_GLOB global;
  REF_INT new_cell;
  REF_INT part;
  REF_INT local_c8;
  REF_INT local_c4;
  REF_EDGE local_c0;
  REF_GLOB local_b8;
  REF_INT local_b0;
  int local_ac;
  REF_INT local_a8 [4];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  REF_INT local_84;
  
  pRVar1 = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar2 = ref_geom_constrain_all(ref_grid);
  if (uVar2 == 0) {
    uVar2 = ref_edge_create(&local_c0,ref_grid);
    ref_edge_00 = local_c0;
    if (uVar2 == 0) {
      uVar2 = local_c0->n;
      if ((int)uVar2 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1007,"ref_geom_enrich3","malloc edge_node of REF_INT negative");
        return 1;
      }
      __s = malloc((ulong)uVar2 * 8);
      if (__s == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1007,"ref_geom_enrich3","malloc edge_node of REF_INT NULL");
        return 2;
      }
      if ((ulong)uVar2 != 0) {
        uVar6 = 1;
        if (1 < (int)(uVar2 * 2)) {
          uVar6 = (ulong)(uVar2 * 2);
        }
        memset(__s,0xff,uVar6 << 2);
      }
      local_c8 = 0;
      if (0 < ref_edge_00->n) {
        do {
          uVar2 = ref_edge_part(ref_edge_00,local_c8,&local_ac);
          if (uVar2 != 0) {
            pcVar9 = "edge part";
            uVar5 = 0x1009;
            goto LAB_00145c45;
          }
          if (pRVar1->id == local_ac) {
            uVar2 = ref_node_next_global(ref_node,&local_b8);
            if (uVar2 != 0) {
              pcVar9 = "next global";
              uVar5 = 0x100c;
              goto LAB_00145c45;
            }
            uVar2 = ref_node_add(ref_node,local_b8,&local_c4);
            if (uVar2 != 0) {
              pcVar9 = "add node";
              uVar5 = 0x100d;
              goto LAB_00145c45;
            }
            *(REF_INT *)((long)__s + (long)local_c8 * 8) = local_c4;
            uVar2 = ref_node_interpolate_edge
                              (ref_node,local_c0->e2n[(long)local_c8 * 2],
                               local_c0->e2n[local_c8 * 2 + 1],0.3333333333333333,local_c4);
            if (uVar2 != 0) {
              pcVar9 = "new node";
              uVar5 = 0x1011;
              goto LAB_00145c45;
            }
            uVar2 = ref_geom_add_constrain_midnode
                              (ref_grid,local_c0->e2n[(long)local_c8 * 2],
                               local_c0->e2n[local_c8 * 2 + 1],0.3333333333333333,local_c4);
            if (uVar2 != 0) {
              pcVar9 = "new geom";
              uVar5 = 0x1015;
              goto LAB_00145c45;
            }
            uVar2 = ref_node_next_global(ref_node,&local_b8);
            if (uVar2 != 0) {
              pcVar9 = "next global";
              uVar5 = 0x1017;
              goto LAB_00145c45;
            }
            uVar2 = ref_node_add(ref_node,local_b8,&local_c4);
            if (uVar2 != 0) {
              pcVar9 = "add node";
              uVar5 = 0x1018;
              goto LAB_00145c45;
            }
            *(REF_INT *)((long)__s + (long)local_c8 * 8 + 4) = local_c4;
            uVar2 = ref_node_interpolate_edge
                              (ref_node,local_c0->e2n[local_c8 * 2],
                               local_c0->e2n[(long)local_c8 * 2 + 1],0.6666666666666666,local_c4);
            if (uVar2 != 0) {
              pcVar9 = "new node";
              uVar5 = 0x101c;
              goto LAB_00145c45;
            }
            uVar2 = ref_geom_add_constrain_midnode
                              (ref_grid,local_c0->e2n[(long)local_c8 * 2],
                               local_c0->e2n[local_c8 * 2 + 1],0.6666666666666666,local_c4);
            if (uVar2 != 0) {
              pcVar9 = "new geom";
              uVar5 = 0x1020;
              goto LAB_00145c45;
            }
          }
          local_c8 = local_c8 + 1;
          ref_edge_00 = local_c0;
        } while (local_c8 < local_c0->n);
      }
      pRVar8 = ref_grid->cell[0];
      if (0 < pRVar8->max) {
        RVar10 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar8,RVar10,local_a8);
          if (RVar3 == 0) {
            local_a8[ref_grid->cell[2]->node_per] = local_a8[ref_grid->cell[0]->node_per];
            uVar2 = ref_edge_with(local_c0,local_a8[0],local_a8[1],&local_c8);
            if (uVar2 != 0) {
              pcVar9 = "find edge01";
              uVar5 = 0x1028;
              goto LAB_00145c45;
            }
            lVar7 = (long)local_c8;
            lVar4 = lVar7 * 2;
            if (local_a8[0] == local_c0->e2n[lVar7 * 2]) {
              local_a8[2] = *(REF_INT *)((long)__s + lVar7 * 8);
              lVar4 = (long)(int)((uint)lVar4 | 1);
            }
            else {
              local_a8[2] = *(REF_INT *)((long)__s + (long)(int)((uint)lVar4 | 1) * 4);
            }
            local_a8[3] = *(undefined4 *)((long)__s + lVar4 * 4);
            uVar2 = ref_cell_add(ref_grid->cell[2],local_a8,&local_b0);
            if (uVar2 != 0) {
              pcVar9 = "add";
              uVar5 = 0x1031;
              goto LAB_00145c45;
            }
          }
          RVar10 = RVar10 + 1;
          pRVar8 = ref_grid->cell[0];
        } while (RVar10 < pRVar8->max);
      }
      pRVar8 = ref_grid->cell[3];
      if (0 < pRVar8->max) {
        iVar11 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar8,iVar11,local_a8);
          if (RVar3 == 0) {
            uVar2 = ref_node_next_global(ref_node,&local_b8);
            if (uVar2 != 0) {
              pcVar9 = "next global";
              uVar5 = 0x1035;
              goto LAB_00145c45;
            }
            uVar2 = ref_node_add(ref_node,local_b8,&local_c4);
            if (uVar2 != 0) {
              pcVar9 = "add node";
              uVar5 = 0x1036;
              goto LAB_00145c45;
            }
            uVar2 = ref_node_interpolate_face(ref_node,local_a8[0],local_a8[1],local_a8[2],local_c4)
            ;
            if (uVar2 != 0) {
              pcVar9 = "new node";
              uVar5 = 0x1038;
              goto LAB_00145c45;
            }
            uVar2 = ref_geom_add_constrain_inside_midnode(ref_grid,local_a8,local_c4);
            if (uVar2 != 0) {
              pcVar9 = "new node";
              uVar5 = 0x103a;
              goto LAB_00145c45;
            }
            local_84 = local_c4;
            local_a8[ref_grid->cell[5]->node_per] = local_a8[ref_grid->cell[3]->node_per];
            uVar2 = ref_edge_with(local_c0,local_a8[0],local_a8[1],&local_c8);
            if (uVar2 != 0) {
              pcVar9 = "find edge01";
              uVar5 = 0x1040;
              goto LAB_00145c45;
            }
            lVar7 = (long)local_c8;
            lVar4 = lVar7 * 2;
            if (local_a8[0] == local_c0->e2n[lVar7 * 2]) {
              local_a8[3] = *(undefined4 *)((long)__s + lVar7 * 8);
              lVar4 = (long)(int)((uint)lVar4 | 1);
            }
            else {
              local_a8[3] = *(undefined4 *)((long)__s + (long)(int)((uint)lVar4 | 1) * 4);
            }
            local_98 = *(undefined4 *)((long)__s + lVar4 * 4);
            uVar2 = ref_edge_with(local_c0,local_a8[1],local_a8[2],&local_c8);
            if (uVar2 != 0) {
              pcVar9 = "find edge12";
              uVar5 = 0x1048;
              goto LAB_00145c45;
            }
            lVar7 = (long)local_c8;
            lVar4 = lVar7 * 2;
            if (local_a8[1] == local_c0->e2n[lVar7 * 2]) {
              local_94 = *(undefined4 *)((long)__s + lVar7 * 8);
              lVar4 = (long)(int)((uint)lVar4 | 1);
            }
            else {
              local_94 = *(undefined4 *)((long)__s + (long)(int)((uint)lVar4 | 1) * 4);
            }
            local_90 = *(undefined4 *)((long)__s + lVar4 * 4);
            uVar2 = ref_edge_with(local_c0,local_a8[2],local_a8[0],&local_c8);
            if (uVar2 != 0) {
              pcVar9 = "find edge20";
              uVar5 = 0x1050;
              goto LAB_00145c45;
            }
            lVar7 = (long)local_c8;
            lVar4 = lVar7 * 2;
            if (local_a8[2] == local_c0->e2n[lVar7 * 2]) {
              local_8c = *(undefined4 *)((long)__s + lVar7 * 8);
              lVar4 = (long)(int)((uint)lVar4 | 1);
            }
            else {
              local_8c = *(undefined4 *)((long)__s + (long)(int)((uint)lVar4 | 1) * 4);
            }
            local_88 = *(undefined4 *)((long)__s + lVar4 * 4);
            uVar2 = ref_cell_add(ref_grid->cell[5],local_a8,&local_b0);
            if (uVar2 != 0) {
              pcVar9 = "add";
              uVar5 = 0x1059;
              goto LAB_00145c45;
            }
          }
          iVar11 = iVar11 + 1;
          pRVar8 = ref_grid->cell[3];
        } while (iVar11 < pRVar8->max);
      }
      free(__s);
      uVar2 = ref_edge_free(local_c0);
      if (uVar2 == 0) {
        pRVar8 = ref_grid->cell[0];
        if (0 < pRVar8->max) {
          RVar10 = 0;
          do {
            if (pRVar8->c2n[(long)RVar10 * (long)pRVar8->size_per] != -1) {
              ref_cell_remove(pRVar8,RVar10);
              pRVar8 = ref_grid->cell[0];
            }
            RVar10 = RVar10 + 1;
          } while (RVar10 < pRVar8->max);
        }
        pRVar8 = ref_grid->cell[3];
        if (0 < pRVar8->max) {
          iVar11 = 0;
          do {
            if (pRVar8->c2n[(long)iVar11 * (long)pRVar8->size_per] != -1) {
              ref_cell_remove(pRVar8,iVar11);
              pRVar8 = ref_grid->cell[3];
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < pRVar8->max);
          return 0;
        }
        return 0;
      }
      pcVar9 = "free edge";
      uVar5 = 0x105d;
    }
    else {
      pcVar9 = "edge";
      uVar5 = 0x1006;
    }
  }
  else {
    pcVar9 = "constrain";
    uVar5 = 0x1004;
  }
LAB_00145c45:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
         "ref_geom_enrich3",(ulong)uVar2,pcVar9);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_enrich3(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, *edge_node, part, node;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;
  REF_DBL t;

  RSS(ref_geom_constrain_all(ref_grid), "constrain");

  RSS(ref_edge_create(&ref_edge, ref_grid), "edge");
  ref_malloc_init(edge_node, 2 * ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      t = 1.0 / 3.0;
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[0 + 2 * edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new node");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new geom");
      t = 2.0 / 3.0;
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[1 + 2 * edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new node");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new geom");
    }
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_ed3(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];

    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    if (nodes[0] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[2] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[3] = edge_node[1 + 2 * edge];
    } else {
      nodes[2] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[3] = edge_node[0 + 2 * edge];
    }

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), nodes, &new_cell), "add");
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "add node");
    RSS(ref_node_interpolate_face(ref_node, nodes[0], nodes[1], nodes[2], node),
        "new node");
    RSS(ref_geom_add_constrain_inside_midnode(ref_grid, nodes, node),
        "new node");
    nodes[9] = node;

    nodes[ref_cell_id_index(ref_grid_tr3(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];

    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    if (nodes[0] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[3] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[4] = edge_node[1 + 2 * edge];
    } else {
      nodes[3] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[4] = edge_node[0 + 2 * edge];
    }
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge12");
    if (nodes[1] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[5] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[6] = edge_node[1 + 2 * edge];
    } else {
      nodes[5] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[6] = edge_node[0 + 2 * edge];
    }
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge20");
    if (nodes[2] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[7] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[8] = edge_node[1 + 2 * edge];
    } else {
      nodes[7] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[8] = edge_node[0 + 2 * edge];
    }

    RSS(ref_cell_add(ref_grid_tr3(ref_grid), nodes, &new_cell), "add");
  }

  ref_free(edge_node);
  RSS(ref_edge_free(ref_edge), "free edge");

  each_ref_cell_valid_cell(ref_grid_edg(ref_grid), cell) {
    ref_cell_remove(ref_grid_edg(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tri(ref_grid), cell) {
    ref_cell_remove(ref_grid_tri(ref_grid), cell);
  }

  return REF_SUCCESS;
}